

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::Clara::Args::Args
          (Args *this,
          initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          args)

{
  pointer pcVar1;
  iterator pbVar2;
  allocator_type local_21;
  
  pbVar2 = args._M_array;
  (this->m_exeName)._M_dataplus._M_p = (pointer)&(this->m_exeName).field_2;
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + pbVar2->_M_string_length)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string_const*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_args,
             pbVar2 + 1,pbVar2 + args._M_len,&local_21);
  return;
}

Assistant:

Args::Args(std::initializer_list<std::string> args) :
            m_exeName(*args.begin()),
            m_args(args.begin() + 1, args.end()) {}